

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void Lowerer::InsertAddWithOverflowCheck
               (bool needFlags,Opnd *dst,Opnd *src1,Opnd *src2,Instr *insertBeforeInstr,
               Instr **onOverflowInsertBeforeInstrRef)

{
  Func *func_00;
  LabelInstr *target;
  LabelInstr *continueLabel;
  Func *func;
  Instr **onOverflowInsertBeforeInstrRef_local;
  Instr *insertBeforeInstr_local;
  Opnd *src2_local;
  Opnd *src1_local;
  Opnd *dst_local;
  bool needFlags_local;
  
  func_00 = insertBeforeInstr->m_func;
  InsertAdd(needFlags,dst,src1,src2,insertBeforeInstr);
  target = IR::LabelInstr::New(Label,func_00,false);
  InsertBranch(JNO,target,insertBeforeInstr);
  *onOverflowInsertBeforeInstrRef = &target->super_Instr;
  return;
}

Assistant:

void Lowerer::InsertAddWithOverflowCheck(
    const bool needFlags,
    IR::Opnd *const dst,
    IR::Opnd *src1,
    IR::Opnd *src2,
    IR::Instr *const insertBeforeInstr,
    IR::Instr **const onOverflowInsertBeforeInstrRef)
{
    Func * func = insertBeforeInstr->m_func;
    InsertAdd(needFlags, dst, src1, src2, insertBeforeInstr);

    IR::LabelInstr *const continueLabel = IR::LabelInstr::New(Js::OpCode::Label, func, false);
    InsertBranch(LowererMD::MDNotOverflowBranchOpcode, continueLabel, insertBeforeInstr);

    *onOverflowInsertBeforeInstrRef = continueLabel;
}